

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O2

void avro::json::testNull(void)

{
  Entity *this;
  Entity n;
  long *local_70;
  undefined4 local_68;
  undefined4 local_64;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char *local_18;
  
  this = &n;
  avro::json::loadEntity((char *)&n);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_40,0x66,&local_50);
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_001d6a20;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_18 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_58 = "";
  local_64 = _n;
  local_68 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
            (&local_30,&local_60,0x66,1,2,&local_64,"n.type()",&local_68,"etNull");
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 8))();
  }
  return;
}

Assistant:

static void testNull()
{
    Entity n = loadEntity("null");
    BOOST_CHECK_EQUAL(n.type(), etNull);

}